

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

bool __thiscall smf::MidiFile::writeHex(MidiFile *this,ostream *out,int width)

{
  ostream *poVar1;
  byte bVar2;
  long lVar3;
  undefined1 *puVar4;
  ostream oVar5;
  size_t in_RCX;
  void *__buf;
  int iVar6;
  ulong uVar7;
  int iVar8;
  stringstream tempstream;
  char local_1e0;
  undefined7 uStack_1df;
  uint local_1d8;
  undefined1 local_1d0 [16];
  ulong local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  write(this,(int)local_1a8,__buf,in_RCX);
  std::__cxx11::stringbuf::str();
  if ((undefined1 *)CONCAT71(uStack_1df,local_1e0) != local_1d0) {
    operator_delete((undefined1 *)CONCAT71(uStack_1df,local_1e0));
  }
  iVar8 = 0x19;
  if (-1 < width) {
    iVar8 = width;
  }
  if (0 < (int)local_1d8) {
    local_1c0 = (ulong)(local_1d8 & 0x7fffffff);
    iVar6 = 1;
    uVar7 = 0;
    do {
      std::__cxx11::stringbuf::str();
      puVar4 = (undefined1 *)CONCAT71(uStack_1df,local_1e0);
      bVar2 = puVar4[uVar7];
      if (puVar4 != local_1d0) {
        operator_delete(puVar4);
      }
      lVar3 = *(long *)out;
      *(uint *)(out + *(long *)(lVar3 + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(lVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(out + *(long *)(lVar3 + -0x18) + 0x10) = 2;
      poVar1 = out + *(long *)(lVar3 + -0x18);
      if (out[*(long *)(lVar3 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar5 = (ostream)std::ios::widen((char)poVar1);
        poVar1[0xe0] = oVar5;
        poVar1[0xe1] = (ostream)0x1;
      }
      poVar1[0xe0] = (ostream)0x30;
      std::ostream::operator<<((ostream *)out,(uint)bVar2);
      if (iVar8 == 0) {
        if ((long)uVar7 < (long)(int)(local_1d8 - 1)) {
          local_1e0 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>(out,&local_1e0,1);
        }
      }
      else {
        if ((long)uVar7 < (long)(int)(local_1d8 - 1)) {
          local_1e0 = ' ';
          if (iVar6 % iVar8 == 0) {
            local_1e0 = '\n';
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,&local_1e0,1);
        }
        iVar6 = iVar6 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (local_1c0 != uVar7);
  }
  if (iVar8 != 0) {
    local_1e0 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(out,&local_1e0,1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return true;
}

Assistant:

bool MidiFile::writeHex(std::ostream& out, int width) {
	std::stringstream tempstream;
	MidiFile::write(tempstream);
	int len = (int)tempstream.str().length();
	int wordcount = 1;
	int linewidth = width >= 0 ? width : 25;
	for (int i=0; i<len; i++) {
		int value = (unsigned char)tempstream.str()[i];
		out << std::hex << std::setw(2) << std::setfill('0') << value;
		if (linewidth) {
			if (i < len - 1) {
				out << ((wordcount % linewidth) ? ' ' : '\n');
			}
			wordcount++;
		} else {
			// print with no line breaks
			if (i < len - 1) {
				out << ' ';
			}
		}
	}
	if (linewidth) {
		out << '\n';
	}
	return true;
}